

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::TangentCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *tangent,int icase)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long lVar5;
  ostream *poVar6;
  int i_1;
  int j;
  int i;
  long lVar7;
  int i_2;
  TPZTensor<double> obj;
  TPZDecomposed objdec;
  double local_310;
  TPZTensor<double> local_2e8;
  TPZDecomposed local_290;
  
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  lVar7 = 0;
  TPZVec<double>::TPZVec(&local_2e8.fData.super_TPZVec<double>,0);
  local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  local_2e8.fData.super_TPZVec<double>.fStore = local_2e8.fData.fExtAlloc;
  local_2e8.fData.super_TPZVec<double>.fNElements = 6;
  local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_2e8.fData.fExtAlloc[0] = 0.0;
  local_2e8.fData.fExtAlloc[1] = 0.0;
  local_2e8.fData.fExtAlloc[2] = 0.0;
  local_2e8.fData.fExtAlloc[3] = 0.0;
  local_2e8.fData.fExtAlloc[4] = 0.0;
  local_2e8.fData.fExtAlloc[5] = 0.0;
  pdVar4 = state->fElem;
  do {
    local_2e8.fData.fExtAlloc[lVar7] = pdVar4[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(&local_290,&local_2e8);
  if ((uint)icase < 3) {
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (tangent,1,9);
    lVar7 = 0;
    do {
      gEigval[lVar7] = local_290.fEigenvalues.super_TPZVec<double>.fStore[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      if (((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar5 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      tangent->fElem[lVar5 * lVar7] =
           local_290.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
           super_TPZVec<double>.fStore[lVar7];
      if ((lVar5 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar5 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      tangent->fElem[lVar5 * 6] =
           local_290.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
           super_TPZVec<double>.fStore[1];
      if ((lVar5 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar5 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      tangent->fElem[lVar5 * 7] =
           local_290.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
           super_TPZVec<double>.fStore[2];
      if ((lVar5 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      tangent->fElem[(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 8] =
           local_290.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
           super_TPZVec<double>.fStore[4];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    local_310 = 0.0;
    lVar7 = 0;
    do {
      if (((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar5 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar5 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_310 = local_310 +
                  tangent->fElem[lVar5 * lVar7] *
                  tangent->fElem
                  [(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    if (((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar1 = *tangent->fElem;
    if (((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar7 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar2 = tangent->fElem[lVar7 * 3];
    if ((lVar7 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar3 = tangent->fElem[(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 5];
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c]
    )(tangent,"tangent",&std::cout,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sum2 = ",7);
    poVar6 = std::ostream::_M_insert<double>(dVar1 + dVar2 + dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sum = ",6);
    poVar6 = std::ostream::_M_insert<double>(local_310);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  TPZManVector<TPZTensor<double>,_3>::~TPZManVector(&local_290.fEigentensors);
  TPZManVector<TPZManVector<double,_3>,_3>::~TPZManVector(&local_290.fEigenvectors);
  TPZManVector<double,_3>::~TPZManVector(&local_290.fEigenvalues);
  if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore ==
      local_290.fGeometricMultiplicity.fExtAlloc) {
    local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore = (uint *)0x0;
  }
  local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fNAlloc = 0;
  local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0189f2e0;
  if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore != (uint *)0x0) {
    operator_delete__(local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore);
  }
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  if (local_2e8.fData.super_TPZVec<double>.fStore == local_2e8.fData.fExtAlloc) {
    local_2e8.fData.super_TPZVec<double>.fStore = (double *)0x0;
  }
  local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_2e8.fData.super_TPZVec<double>.fStore != (double *)0x0) {
    operator_delete__(local_2e8.fData.super_TPZVec<double>.fStore);
  }
  return;
}

Assistant:

static void TangentCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &tangent, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    tangent.Resize(1, 9);
                    for (int i = 0; i < 3; i++) {
                        gEigval[i] = objdec.fEigenvalues[i];
                    }
                    for (int j = 0; j < 6; j++) {
                        tangent(0, j) = objdec.fEigentensors[icase][j];
                        tangent(0, 6) = objdec.fEigentensors[icase].XY();
                        tangent(0, 7) = objdec.fEigentensors[icase].XZ();
                        tangent(0, 8) = objdec.fEigentensors[icase].YZ();
                    }
                    STATE sum = 0., sum2 = 0.;
                    for (int i = 0; i < 9; i++) {
                        sum += tangent(0, i) * tangent(0, i);
                    }
                    sum2 = tangent(0, _XX_) + tangent(0, _YY_) + tangent(0, _ZZ_);
                    tangent.Print("tangent");
                    std::cout << "sum2 = " << sum2 << std::endl;
                    std::cout << "sum = " << sum << std::endl;
                }
                    break;
                default:
                    break;
            }
        }